

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall
camp::PropertyNotFound::PropertyNotFound(PropertyNotFound *this,PropertyNotFound *param_1)

{
  PropertyNotFound *param_1_local;
  PropertyNotFound *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__PropertyNotFound_001fd568;
  return;
}

Assistant:

class CAMP_API PropertyNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested property
     * \param className Name of the owner metaclass
     */
    PropertyNotFound(const std::string& name, const std::string& className);
}